

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Curiosity.cpp
# Opt level: O1

void __thiscall
chrono::curiosity::CuriosityUpright::CuriosityUpright
          (CuriosityUpright *this,string *name,ChFrame<double> *rel_pos,
          shared_ptr<chrono::ChMaterialSurface> *mat)

{
  shared_ptr<chrono::ChMaterialSurface> local_c8;
  ChQuaternion<double> local_b8;
  ChFrame<double> local_98;
  
  local_c8.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (mat->super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_c8.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (mat->super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>).
          _M_refcount._M_pi;
  if (local_c8.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_c8.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_c8.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_c8.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_c8.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  CuriosityPart::CuriosityPart(&this->super_CuriosityPart,name,rel_pos,&local_c8,false);
  if (local_c8.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_c8.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  (this->super_CuriosityPart)._vptr_CuriosityPart = (_func_int **)&PTR__CuriosityPart_0017ea38;
  std::__cxx11::string::_M_replace
            ((ulong)&(this->super_CuriosityPart).m_mesh_name,0,
             (char *)(this->super_CuriosityPart).m_mesh_name._M_string_length,0x16bc69);
  (this->super_CuriosityPart).m_color.R = 0.4;
  (this->super_CuriosityPart).m_color.G = 0.4;
  (this->super_CuriosityPart).m_color.B = 0.7;
  (this->super_CuriosityPart).m_mass = 6.0;
  (this->super_CuriosityPart).m_inertia.m_data[0] = 0.042;
  (this->super_CuriosityPart).m_inertia.m_data[1] = 0.042;
  (this->super_CuriosityPart).m_inertia.m_data[2] = 0.024;
  local_b8.m_data[0] = 1.0;
  local_b8.m_data[1] = 0.0;
  local_b8.m_data[2] = 0.0;
  local_b8.m_data[3] = 0.0;
  local_98._vptr_ChFrame = (_func_int **)&PTR__ChFrame_0017db90;
  local_98.coord.pos.m_data[0] = 0.0;
  local_98.coord.pos.m_data[1] = 0.0;
  local_98.coord.pos.m_data[2] = 0.0;
  local_98.coord.rot.m_data[0] = 1.0;
  local_98.coord.rot.m_data[1] = 0.0;
  local_98.coord.rot.m_data[2] = 0.0;
  local_98.coord.rot.m_data[3] = 0.0;
  ChMatrix33<double>::ChMatrix33(&local_98.Amatrix,&local_b8);
  ChFrame<double>::operator=(&(this->super_CuriosityPart).m_cog,&local_98);
  return;
}

Assistant:

CuriosityUpright::CuriosityUpright(const std::string& name,
                                   const ChFrame<>& rel_pos,
                                   std::shared_ptr<ChMaterialSurface> mat)
    : CuriosityPart(name, rel_pos, mat, false) {
    m_mesh_name = "curiosity_steer";
    m_color = ChColor(0.4f, 0.4f, 0.7f);

    m_mass = 6;
    m_inertia = ChVector<>(0.007, 0.007, 0.004) * m_mass;
    m_cog = ChFrame<>();
}